

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::binary::swap_bytes<signed_char>(binary *this,Read<signed_char> *array,bool needs_swapping)

{
  undefined7 in_register_00000011;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  LO n;
  Read<signed_char> RVar2;
  Write<signed_char> out;
  type f;
  allocator local_61;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  string local_40;
  Write<signed_char> local_20;
  
  if ((int)CONCAT71(in_register_00000011,needs_swapping) == 0) {
    Write<signed_char>::Write((Write<signed_char> *)this,&array->write_);
    pvVar1 = extraout_RDX;
  }
  else {
    Write<signed_char>::Write(&local_20,&array->write_);
    std::__cxx11::string::string((string *)&local_40,"",&local_61);
    deep_copy<signed_char>((Omega_h *)&local_60,(Read<signed_char> *)&local_20,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    Write<signed_char>::~Write(&local_20);
    Write<signed_char>::Write((Write<signed_char> *)&local_40,&local_60);
    if (((ulong)local_60.shared_alloc_.alloc & 1) == 0) {
      n = (LO)(local_60.shared_alloc_.alloc)->size;
    }
    else {
      n = (LO)((ulong)local_60.shared_alloc_.alloc >> 3);
    }
    parallel_for<Omega_h::binary::swap_bytes<signed_char>(Omega_h::Read<signed_char>,bool)::_lambda(int)_1_>
              (n,(type *)&local_40,"swap_if_needed");
    Write<signed_char>::Write(&local_50,&local_60);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_50);
    Write<signed_char>::~Write(&local_50);
    Write<signed_char>::~Write((Write<signed_char> *)&local_40);
    Write<signed_char>::~Write(&local_60);
    pvVar1 = extraout_RDX_00;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<T> swap_bytes(Read<T> array, bool needs_swapping) {
  if (!needs_swapping) return array;
  Write<T> out = deep_copy(array);
  auto f = OMEGA_H_LAMBDA(LO i) { SwapBytes<T>::swap(&out[i]); };
  parallel_for(out.size(), f, "swap_if_needed");
  return out;
}